

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_0::AsyncStreamFd::write(AsyncStreamFd *this,int __fd,void *__buf,size_t __n)

{
  _func_int **pp_Var1;
  SourceLocation location;
  AsyncInputStream AVar2;
  int osErrorNumber;
  ssize_t sVar3;
  void *pvVar4;
  undefined4 in_register_00000034;
  AsyncStreamFd *pAVar5;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:202:50)>
  *location_00;
  undefined1 local_88 [8];
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Fault f;
  AsyncInputStream local_58;
  anon_class_24_2_4f696100_for_func local_50;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  pAVar5 = (AsyncStreamFd *)CONCAT44(in_register_00000034,__fd);
  do {
    sVar3 = ::write((pAVar5->super_OwnedFileDescriptor).fd,__buf,__n);
    if (-1 < sVar3) {
      if (__n - sVar3 != 0) {
        (*(pAVar5->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream[0x14])(this,pAVar5,(long)__buf + sVar3,__n - sVar3);
        return (ssize_t)this;
      }
      goto LAB_003e6204;
    }
    osErrorNumber = kj::_::Debug::getOsErrorNumber(true);
  } while (osErrorNumber == -1);
  if (osErrorNumber == 0) {
    UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_88);
    continuationTracePtr =
         kj::_::
         SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:202:50)>
         ::anon_class_24_2_4f696100_for_func::operator();
    pp_Var1 = ((SleepHooks *)&((PromiseArenaMember *)local_88)->arena)->_vptr_SleepHooks;
    local_50.buffer.ptr = (uchar *)__buf;
    local_50.buffer.size_ = __n;
    local_50.this = pAVar5;
    if (pp_Var1 == (_func_int **)0x0 || (ulong)((long)local_88 - (long)pp_Var1) < 0x38) {
      pvVar4 = operator_new(0x400);
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:202:50)>
                     *)((long)pvVar4 + 0x3c8);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::write(kj::ArrayPtr<unsigned_char_const>)::_lambda()_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::write(kj::ArrayPtr<unsigned_char_const>)::_lambda()_2_,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_88,&local_50,
                 &continuationTracePtr);
      *(void **)((long)pvVar4 + 0x3d0) = pvVar4;
    }
    else {
      ((SleepHooks *)&((PromiseArenaMember *)local_88)->arena)->_vptr_SleepHooks = (_func_int **)0x0
      ;
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:202:50)>
                     *)((unsigned_long *)((long)local_88 + -0x40) + 1);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::write(kj::ArrayPtr<unsigned_char_const>)::_lambda()_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::write(kj::ArrayPtr<unsigned_char_const>)::_lambda()_2_,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_88,&local_50,
                 &continuationTracePtr);
      *(_func_int ***)((long)local_88 + -0x30) = pp_Var1;
    }
    f.exception = (Exception *)&DAT_0042a172;
    location.function = &DAT_0042a1d1;
    location.fileName = &DAT_0042a172;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    intermediate.ptr = (PromiseNode *)location_00;
    kj::_::maybeChain<void>((OwnPromiseNode *)&local_58,(Promise<void> *)&intermediate,location);
    AVar2._vptr_AsyncInputStream = local_58._vptr_AsyncInputStream;
    local_58._vptr_AsyncInputStream = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_58);
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = AVar2._vptr_AsyncInputStream;
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_88);
  }
  else {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0xba,osErrorNumber,"n = ::write(fd, buffer.begin(), buffer.size())","");
    kj::_::Debug::Fault::~Fault(&f);
LAB_003e6204:
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = ::write(fd, buffer.begin(), buffer.size())) {
      // Error.

      // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
      // a bug that exists in both Clang and GCC:
      //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
      //   http://llvm.org/bugs/show_bug.cgi?id=12286
      goto error;
    }
    if (false) {
    error:
      return kj::READY_NOW;
    }

    if (n < 0) {
      // EAGAIN -- need to wait for writability and try again.
      return observer.whenBecomesWritable().then([buffer, this]() {
        return write(buffer);
      });
    } else if (n == buffer.size()) {
      // All done.
      return READY_NOW;
    } else {
      // Fewer than `size` bytes were written, but we CANNOT assume we're out of buffer space, as
      // Linux is known to return partial reads/writes when interrupted by a signal -- yes, even
      // for non-blocking operations. So, we'll need to write() again now, even though it will
      // almost certainly fail with EAGAIN. See comments in the read path for more info.
      buffer = buffer.slice(n);
      return write(buffer);
    }
  }